

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O2

string * __thiscall
picPageAnalyzer::getOriginalPicSourceURL_abi_cxx11_
          (string *__return_storage_ptr__,picPageAnalyzer *this)

{
  uint uVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string result_middle;
  
  std::__cxx11::string::string((string *)&local_90,"Download original",&local_91);
  std::__cxx11::string::string((string *)&local_70,"href=\"",&local_92);
  pageAnalyzer::getInfoFromContent
            (&result_middle,&this->super_pageAnalyzer,&local_90,-1,0x12,&local_70,'\"');
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"&amp;",(allocator *)&local_70);
  uVar1 = std::__cxx11::string::find((string *)&result_middle,(ulong)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  while (uVar1 != 0xffffffff) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = 0;
    }
    for (uVar5 = 0; cVar3 = (char)__return_storage_ptr__, uVar2 != uVar5; uVar5 = uVar5 + 1) {
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::string((string *)&local_90,"&amp;",(allocator *)&local_70);
    iVar4 = (int)uVar5 + (int)local_90._M_string_length;
    std::__cxx11::string::~string((string *)&local_90);
    for (uVar2 = (ulong)iVar4; uVar2 < result_middle._M_string_length; uVar2 = uVar2 + 1) {
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::_M_assign((string *)&result_middle);
    std::__cxx11::string::string((string *)&local_90,"&amp;",(allocator *)&local_70);
    uVar1 = std::__cxx11::string::find((string *)&result_middle,(ulong)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&result_middle);
  return __return_storage_ptr__;
}

Assistant:

std::string picPageAnalyzer::getOriginalPicSourceURL()
{
    std::string result_middle = this->getInfoFromContent(std::string("Download original"), -1, GETMODE_PART, std::string("href=\""), '\"');
    std::string result = std::string("");

    //Part to handle special character "&amp;". It will be replaced by a more uniform function in the future
    int errpos = result_middle.find(std::string("&amp;"));
    while(errpos != std::string::npos)
    {
        result.clear();
        int rpos = 0;
        for(rpos = 0; rpos < errpos; rpos++)
            result += result_middle[rpos];

        result += result_middle[errpos];

        rpos += std::string("&amp;").length();

        for(; rpos < result_middle.length(); rpos++)
            result += result_middle[rpos];

        result_middle = result;

        errpos = result_middle.find(std::string("&amp;"));
    }
    return result;
}